

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::WriteAliasedRaw
          (CopyingOutputStreamAdaptor *this,void *data,int size)

{
  bool bVar1;
  uint uVar2;
  int v1;
  int v2;
  char *failure_msg;
  LogMessage *pLVar3;
  int local_64;
  void *pvStack_60;
  int out_size;
  void *out;
  LogMessage local_48;
  Voidify local_31;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  void *pvStack_20;
  int size_local;
  void *data_local;
  CopyingOutputStreamAdaptor *this_local;
  
  absl_log_internal_check_op_result._4_4_ = size;
  pvStack_20 = data;
  data_local = this;
  if (size < this->buffer_size_) {
    while (uVar2 = (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[2])
                             (this,&stack0xffffffffffffffa0,&local_64), (uVar2 & 1) != 0) {
      if ((int)absl_log_internal_check_op_result._4_4_ <= local_64) {
        memcpy(pvStack_60,pvStack_20,(long)(int)absl_log_internal_check_op_result._4_4_);
        (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[3])
                  (this,(ulong)(local_64 - absl_log_internal_check_op_result._4_4_));
        return true;
      }
      memcpy(pvStack_60,pvStack_20,(long)local_64);
      pvStack_20 = (void *)((long)pvStack_20 + (long)local_64);
      absl_log_internal_check_op_result._4_4_ = absl_log_internal_check_op_result._4_4_ - local_64;
    }
    this_local._7_1_ = false;
  }
  else {
    bVar1 = Flush(this);
    if ((bVar1) &&
       (uVar2 = (*this->copying_stream_->_vptr_CopyingOutputStream[2])
                          (this->copying_stream_,pvStack_20,
                           (ulong)absl_log_internal_check_op_result._4_4_), (uVar2 & 1) != 0)) {
      v1 = absl::lts_20250127::log_internal::GetReferenceableValue(this->buffer_used_);
      v2 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
      local_30 = absl::lts_20250127::log_internal::Check_EQImpl(v1,v2,"buffer_used_ == 0");
      if (local_30 != (Nullable<const_char_*>)0x0) {
        failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_48,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                   ,0x158,failure_msg);
        pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar3);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_48);
      }
      this->position_ = (long)(int)absl_log_internal_check_op_result._4_4_ + this->position_;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CopyingOutputStreamAdaptor::WriteAliasedRaw(const void* data, int size) {
  if (size >= buffer_size_) {
    if (!Flush() || !copying_stream_->Write(data, size)) {
      return false;
    }
    ABSL_DCHECK_EQ(buffer_used_, 0);
    position_ += size;
    return true;
  }

  void* out;
  int out_size;
  while (true) {
    if (!Next(&out, &out_size)) {
      return false;
    }

    if (size <= out_size) {
      std::memcpy(out, data, size);
      BackUp(out_size - size);
      break;
    }

    std::memcpy(out, data, out_size);
    data = static_cast<const char*>(data) + out_size;
    size -= out_size;
  }
  return true;
}